

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

char * cmsys::SystemTools::AppendStrings(char *str1,char *str2,char *str3)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  char *newstr;
  size_t len2;
  size_t len1;
  char *str3_local;
  char *str2_local;
  char *str1_local;
  
  if (str1 == (char *)0x0) {
    str1_local = AppendStrings(str2,str3);
  }
  else if (str2 == (char *)0x0) {
    str1_local = AppendStrings(str1,str3);
  }
  else if (str3 == (char *)0x0) {
    str1_local = AppendStrings(str1,str2);
  }
  else {
    sVar1 = strlen(str1);
    sVar2 = strlen(str2);
    sVar3 = strlen(str3);
    str1_local = (char *)operator_new__(sVar1 + sVar2 + sVar3 + 1);
    if (str1_local == (char *)0x0) {
      str1_local = (char *)0x0;
    }
    else {
      strcpy(str1_local,str1);
      strcat(str1_local + sVar1,str2);
      strcat(str1_local + sVar2 + sVar1,str3);
    }
  }
  return str1_local;
}

Assistant:

char* SystemTools::AppendStrings(const char* str1, const char* str2,
                                 const char* str3)
{
  if (!str1) {
    return SystemTools::AppendStrings(str2, str3);
  }
  if (!str2) {
    return SystemTools::AppendStrings(str1, str3);
  }
  if (!str3) {
    return SystemTools::AppendStrings(str1, str2);
  }

  size_t len1 = strlen(str1), len2 = strlen(str2);
  char* newstr = new char[len1 + len2 + strlen(str3) + 1];
  if (!newstr) {
    return 0;
  }
  strcpy(newstr, str1);
  strcat(newstr + len1, str2);
  strcat(newstr + len1 + len2, str3);
  return newstr;
}